

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc_thr.c
# Opt level: O2

void worker(void *arg)

{
  size_t __size;
  uint __line;
  int iVar1;
  int iVar2;
  int iVar3;
  void *__s;
  char *__assertion;
  
  iVar1 = nn_socket(1,0x10);
  if (iVar1 == -1) {
    __assertion = "s != -1";
    __line = 0x30;
  }
  else {
    iVar2 = nn_connect(iVar1,"inproc://inproc_thr");
    if (iVar2 < 0) {
      __assertion = "rc >= 0";
      __line = 0x32;
    }
    else {
      __size = CONCAT44(message_size._4_4_,(int)message_size);
      __s = malloc(__size);
      if (__s == (void *)0x0) {
        __assertion = "buf";
        __line = 0x35;
      }
      else {
        memset(__s,0x6f,__size);
        iVar2 = nn_send(iVar1,0,0,0);
        if (iVar2 == 0) {
          iVar2 = -1;
          do {
            iVar2 = iVar2 + 1;
            if (iVar2 == message_count) {
              free(__s);
              iVar1 = nn_close(iVar1);
              if (iVar1 == 0) {
                return;
              }
              __assertion = "rc == 0";
              __line = 0x42;
              goto LAB_001015df;
            }
            iVar3 = nn_send(iVar1,__s,CONCAT44(message_size._4_4_,(int)message_size),0);
          } while (iVar3 == (int)message_size);
          __assertion = "rc == (int)message_size";
          __line = 0x3d;
        }
        else {
          __assertion = "rc == 0";
          __line = 0x39;
        }
      }
    }
  }
LAB_001015df:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/inproc_thr.c"
                ,__line,"void worker(void *)");
}

Assistant:

void worker (NN_UNUSED void *arg)
{
    int rc;
    int s;
    int i;
    char *buf;

    s = nn_socket (AF_SP, NN_PAIR);
    assert (s != -1);
    rc = nn_connect (s, "inproc://inproc_thr");
    assert (rc >= 0);

    buf = malloc (message_size);
    assert (buf);
    memset (buf, 111, message_size);

    rc = nn_send (s, NULL, 0, 0);
    assert (rc == 0);

    for (i = 0; i != message_count; i++) {
        rc = nn_send (s, buf, message_size, 0);
        assert (rc == (int)message_size);
    }

    free (buf);
    rc = nn_close (s);
    assert (rc == 0);
}